

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::init_progressive(jpeg_decoder *this)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  coeff_buf *pcVar5;
  ulong uVar6;
  ulong uVar7;
  code *pcVar8;
  code *decode_block_func;
  int iVar9;
  long lVar10;
  
  iVar9 = this->m_comps_in_frame;
  if (iVar9 == 4) {
    stop_decoding(this,JPGD_UNSUPPORTED_COLORSPACE);
  }
  for (lVar10 = 0; lVar10 < iVar9; lVar10 = lVar10 + 1) {
    pcVar5 = coeff_buf_open(this,this->m_comp_h_samp[lVar10] * this->m_max_mcus_per_row,
                            this->m_comp_v_samp[lVar10] * this->m_max_mcus_per_col,1,1);
    this->m_dc_coeffs[lVar10] = pcVar5;
    pcVar5 = coeff_buf_open(this,this->m_comp_h_samp[lVar10] * this->m_max_mcus_per_row,
                            this->m_comp_v_samp[lVar10] * this->m_max_mcus_per_col,8,8);
    this->m_ac_coeffs[lVar10] = pcVar5;
    iVar9 = this->m_comps_in_frame;
  }
  iVar9 = 0x3e9;
  while( true ) {
    iVar4 = init_scan(this);
    if (iVar4 == 0) {
      uVar2 = this->m_comps_in_frame;
      this->m_comps_in_scan = uVar2;
      uVar7 = 0;
      uVar6 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar6 = uVar7;
      }
      for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        this->m_comp_list[uVar7] = (int)uVar7;
      }
      bVar3 = calc_mcu_block_order(this);
      if (!bVar3) {
        stop_decoding(this,JPGD_DECODE_ERROR);
      }
      return;
    }
    iVar4 = this->m_spectral_start;
    iVar1 = this->m_spectral_end;
    if ((iVar1 < iVar4) || (0x3f < iVar1)) break;
    if (iVar4 == 0) {
      if (iVar1 != 0) break;
    }
    else if (this->m_comps_in_scan != 1) break;
    pcVar8 = decode_block_ac_first;
    decode_block_func = decode_block_dc_first;
    if (this->m_successive_high != 0) {
      pcVar8 = decode_block_ac_refine;
      decode_block_func = decode_block_dc_refine;
      if (this->m_successive_low != this->m_successive_high + -1) {
        stop_decoding(this,JPGD_BAD_SOS_SUCCESSIVE);
      }
    }
    if (iVar4 != 0) {
      decode_block_func = pcVar8;
    }
    decode_scan(this,decode_block_func);
    this->m_bits_left = 0x10;
    get_bits(this,0x10);
    get_bits(this,0x10);
    iVar9 = iVar9 + -1;
    if (iVar9 == 0) {
      stop_decoding(this,JPGD_TOO_MANY_SCANS);
    }
  }
  stop_decoding(this,JPGD_BAD_SOS_SPECTRAL);
}

Assistant:

void jpeg_decoder::init_progressive()
	{
		int i;

		if (m_comps_in_frame == 4)
			stop_decoding(JPGD_UNSUPPORTED_COLORSPACE);

		// Allocate the coefficient buffers.
		for (i = 0; i < m_comps_in_frame; i++)
		{
			m_dc_coeffs[i] = coeff_buf_open(m_max_mcus_per_row * m_comp_h_samp[i], m_max_mcus_per_col * m_comp_v_samp[i], 1, 1);
			m_ac_coeffs[i] = coeff_buf_open(m_max_mcus_per_row * m_comp_h_samp[i], m_max_mcus_per_col * m_comp_v_samp[i], 8, 8);
		}

		// See https://libjpeg-turbo.org/pmwiki/uploads/About/TwoIssueswiththeJPEGStandard.pdf
		uint32_t total_scans = 0;
		const uint32_t MAX_SCANS_TO_PROCESS = 1000;

		for (; ; )
		{
			int dc_only_scan, refinement_scan;
			pDecode_block_func decode_block_func;

			if (!init_scan())
				break;

			dc_only_scan = (m_spectral_start == 0);
			refinement_scan = (m_successive_high != 0);

			if ((m_spectral_start > m_spectral_end) || (m_spectral_end > 63))
				stop_decoding(JPGD_BAD_SOS_SPECTRAL);

			if (dc_only_scan)
			{
				if (m_spectral_end)
					stop_decoding(JPGD_BAD_SOS_SPECTRAL);
			}
			else if (m_comps_in_scan != 1)  /* AC scans can only contain one component */
				stop_decoding(JPGD_BAD_SOS_SPECTRAL);

			if ((refinement_scan) && (m_successive_low != m_successive_high - 1))
				stop_decoding(JPGD_BAD_SOS_SUCCESSIVE);

			if (dc_only_scan)
			{
				if (refinement_scan)
					decode_block_func = decode_block_dc_refine;
				else
					decode_block_func = decode_block_dc_first;
			}
			else
			{
				if (refinement_scan)
					decode_block_func = decode_block_ac_refine;
				else
					decode_block_func = decode_block_ac_first;
			}

			decode_scan(decode_block_func);

			m_bits_left = 16;
			get_bits(16);
			get_bits(16);

			total_scans++;
			if (total_scans > MAX_SCANS_TO_PROCESS)
				stop_decoding(JPGD_TOO_MANY_SCANS);
		}

		m_comps_in_scan = m_comps_in_frame;

		for (i = 0; i < m_comps_in_frame; i++)
			m_comp_list[i] = i;

		if (!calc_mcu_block_order())
			stop_decoding(JPGD_DECODE_ERROR);
	}